

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSwitch
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Switch *curr)

{
  ulong index;
  Name *pNVar1;
  undefined1 auStack_a8 [8];
  Literals values;
  size_t sStack_68;
  Name target;
  
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  if (*(Expression **)(curr + 0x40) != (Expression *)0x0) {
    visit((Flow *)&stack0xffffffffffffff98,this,*(Expression **)(curr + 0x40));
    Flow::operator=(__return_storage_ptr__,(Flow *)&stack0xffffffffffffff98);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff98);
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
    goto LAB_00130cc0;
    SmallVector<wasm::Literal,_1UL>::operator=
              ((SmallVector<wasm::Literal,_1UL> *)auStack_a8,
               (SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
  }
  visit((Flow *)&stack0xffffffffffffff98,this,*(Expression **)(curr + 0x48));
  Flow::operator=(__return_storage_ptr__,(Flow *)&stack0xffffffffffffff98);
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff98);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    Flow::getSingleValue(__return_storage_ptr__);
    index = ::wasm::Literal::getInteger();
    sStack_68 = *(size_t *)(curr + 0x30);
    target.super_IString.str._M_len = *(size_t *)(curr + 0x38);
    if ((-1 < (long)index) && (index < *(ulong *)(curr + 0x18))) {
      pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(curr + 0x10),
                          index);
      sStack_68 = (pNVar1->super_IString).str._M_len;
      target.super_IString.str._M_len = (size_t)(pNVar1->super_IString).str._M_str;
    }
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = sStack_68;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)target.super_IString.str._M_len;
    SmallVector<wasm::Literal,_1UL>::operator=
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
               (SmallVector<wasm::Literal,_1UL> *)auStack_a8);
  }
LAB_00130cc0:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_a8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSwitch(Switch* curr) {
    NOTE_ENTER("Switch");
    Flow flow;
    Literals values;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
      values = flow.values;
    }
    flow = visit(curr->condition);
    if (flow.breaking()) {
      return flow;
    }
    int64_t index = flow.getSingleValue().getInteger();
    Name target = curr->default_;
    if (index >= 0 && (size_t)index < curr->targets.size()) {
      target = curr->targets[(size_t)index];
    }
    flow.breakTo = target;
    flow.values = values;
    return flow;
  }